

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall google::protobuf::internal::LazyString::Init_abi_cxx11_(LazyString *this)

{
  __pointer_type in_RDI;
  InitValue init_value;
  string *res;
  undefined8 in_stack_ffffffffffffffa0;
  memory_order mVar2;
  char *pcVar1;
  atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_ffffffffffffffa8;
  __pointer_type __p;
  allocator *this_00;
  allocator local_29;
  char *local_28;
  __pointer_type pbStack_20;
  __pointer_type local_10;
  
  mVar2 = (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  WrappedMutex::Lock((WrappedMutex *)0x409d2f);
  local_10 = std::
             atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::load(in_stack_ffffffffffffffa8,mVar2);
  if (local_10 == (__pointer_type)0x0) {
    pcVar1 = *(char **)in_RDI;
    __p = (__pointer_type)in_RDI->_M_string_length;
    this_00 = &local_29;
    local_28 = pcVar1;
    pbStack_20 = __p;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,(ulong)__p,this_00);
    mVar2 = (memory_order)((ulong)pcVar1 >> 0x20);
    local_10 = in_RDI;
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    std::
    atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::store((atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             *)this_00,__p,mVar2);
  }
  WrappedMutex::Unlock((WrappedMutex *)0x409df5);
  return local_10;
}

Assistant:

const std::string& LazyString::Init() const {
  static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
  mu.Lock();
  const std::string* res = inited_.load(std::memory_order_acquire);
  if (res == nullptr) {
    auto init_value = init_value_;
    res = ::new (static_cast<void*>(string_buf_))
        std::string(init_value.ptr, init_value.size);
    inited_.store(res, std::memory_order_release);
  }
  mu.Unlock();
  return *res;
}